

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GradeBook.cpp
# Opt level: O0

void __thiscall GradeBook::setCourseName(GradeBook *this,string *name)

{
  ulong uVar1;
  ostream *poVar2;
  string local_38 [32];
  string *local_18;
  string *name_local;
  GradeBook *this_local;
  
  local_18 = (string *)name;
  name_local = &this->courseName;
  uVar1 = std::__cxx11::string::length();
  if (uVar1 < 0x1a) {
    std::__cxx11::string::operator=((string *)this,local_18);
  }
  uVar1 = std::__cxx11::string::length();
  if (0x19 < uVar1) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)local_18);
    std::__cxx11::string::operator=((string *)this,local_38);
    std::__cxx11::string::~string(local_38);
    poVar2 = std::operator<<((ostream *)&std::cout,"Name \"");
    poVar2 = std::operator<<(poVar2,local_18);
    std::operator<<(poVar2,"\" exceeds maximum length (25).\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"Limiting courseName to first 25 characters.\n");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void GradeBook::setCourseName(const std::string &name) {
    if (name.length() <= 25) { courseName = name; }

    if (name.length() > 25) {
        courseName = name.substr(0, 25);

        std::cout << "Name \"" << name << "\" exceeds maximum length (25).\n";
        std::cout << "Limiting courseName to first 25 characters.\n"
                  << std::endl;
    }
}